

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of-test.c++
# Opt level: O2

void __thiscall kj::TestCase28::run(TestCase28 *this)

{
  anon_union_24_2_a774ebf0_for_OneOf<int,_float,_kj::String>_3 *b;
  anon_union_24_2_a774ebf0_for_OneOf<int,_float,_kj::String>_3 *b_00;
  bool bVar1;
  undefined8 extraout_RDX;
  char (*params) [4];
  undefined8 extraout_RDX_00;
  undefined7 uVar2;
  undefined7 extraout_var;
  char (*extraout_RDX_01) [4];
  char (*extraout_RDX_02) [4];
  undefined8 extraout_RDX_03;
  char (*extraout_RDX_04) [4];
  char (*extraout_RDX_05) [4];
  OneOf<int,_float,_kj::String> var2;
  OneOf<int,_float,_kj::String> var;
  
  var.tag = 0;
  var2.tag = 0x7b;
  OneOf<int,float,kj::String>::init<int,int>((OneOf<int,float,kj::String> *)&var,(int *)&var2);
  params = (char (*) [4])CONCAT71((int7)((ulong)extraout_RDX >> 8),_::Debug::minSeverity < 3);
  if (var.tag != 1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x28,ERROR,"\"failed: expected \" \"var.is<int>()\"",
               (char (*) [31])"failed: expected var.is<int>()");
    uVar2 = (undefined7)((ulong)extraout_RDX_00 >> 8);
    if (var.tag == 2 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[36]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x29,ERROR,"\"failed: expected \" \"!(var.is<float>())\"",
                 (char (*) [36])"failed: expected !(var.is<float>())");
      uVar2 = extraout_var;
    }
    params = (char (*) [4])CONCAT71(uVar2,_::Debug::minSeverity < 3);
    if (var.tag == 3 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x2a,ERROR,"\"failed: expected \" \"!(var.is<String>())\"",
                 (char (*) [37])"failed: expected !(var.is<String>())");
      params = extraout_RDX_01;
    }
  }
  b = &var.field_1;
  if ((var.field_1._0_4_ != 0x7b) && (_::Debug::minSeverity < 3)) {
    var2.tag = 0x7b;
    _::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x2c,ERROR,
               "\"failed: expected \" \"(123) == (var.get<int>())\", 123, var.get<int>()",
               (char (*) [43])"failed: expected (123) == (var.get<int>())",(int *)&var2,
               (int *)b->space);
    params = extraout_RDX_02;
  }
  if (var.tag != 1) {
    _::Debug::Fault::Fault
              ((Fault *)&var2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x32,FAILED,"var.tryGet<int>() != nullptr","");
    _::Debug::Fault::fatal((Fault *)&var2);
  }
  if ((var.field_1._0_4_ != 0x7b) && (_::Debug::minSeverity < 3)) {
    var2.tag = 0x7b;
    _::Debug::log<char_const(&)[374],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x32,ERROR,
               "\"failed: expected \" \"(123) == ((*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<int>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\\\", 50, ::kj::Exception::Type::FAILED, \\\"var.tryGet<int>()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", 123, (*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<int>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\", 50, ::kj::Exception::Type::FAILED, \"var.tryGet<int>()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [374])
                "failed: expected (123) == ((*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<int>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\", 50, ::kj::Exception::Type::FAILED, \"var.tryGet<int>()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(int *)&var2,(int *)b->space);
    params = (char (*) [4])CONCAT71((int7)((ulong)extraout_RDX_03 >> 8),var.tag == 2);
    if (var.tag == 2 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x33,ERROR,"\"failed: expected \" \"var.tryGet<float>() == nullptr\"",
                 (char (*) [48])"failed: expected var.tryGet<float>() == nullptr");
      params = extraout_RDX_04;
    }
    if ((var.tag == 3) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x34,ERROR,"\"failed: expected \" \"var.tryGet<String>() == nullptr\"",
                 (char (*) [49])"failed: expected var.tryGet<String>() == nullptr");
      params = extraout_RDX_05;
    }
  }
  str<char_const(&)[4]>((String *)&var2,(kj *)0x357ec7,params);
  OneOf<int,float,kj::String>::init<kj::String,kj::String>
            ((OneOf<int,float,kj::String> *)&var,(String *)&var2);
  Array<char>::~Array((Array<char> *)&var2);
  if (var.tag == 1) {
    if (2 < _::Debug::minSeverity) goto LAB_00242670;
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x38,ERROR,"\"failed: expected \" \"!(var.is<int>())\"",
               (char (*) [34])"failed: expected !(var.is<int>())");
  }
  if (var.tag == 2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x39,ERROR,"\"failed: expected \" \"!(var.is<float>())\"",
               (char (*) [36])"failed: expected !(var.is<float>())");
  }
  if ((var.tag != 3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x3a,ERROR,"\"failed: expected \" \"var.is<String>()\"",
               (char (*) [34])"failed: expected var.is<String>()");
  }
LAB_00242670:
  bVar1 = operator==("foo",(String *)b);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[48],char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x3c,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (var.get<String>())\", \"foo\", var.get<String>()"
               ,(char (*) [48])"failed: expected (\"foo\") == (var.get<String>())",
               (char (*) [4])0x357ec7,(String *)b);
  }
  if (var.tag == 1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"var.tryGet<int>() == nullptr\"",
               (char (*) [46])"failed: expected var.tryGet<int>() == nullptr");
  }
  if ((var.tag == 2) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
               ,0x3f,ERROR,"\"failed: expected \" \"var.tryGet<float>() == nullptr\"",
               (char (*) [48])"failed: expected var.tryGet<float>() == nullptr");
  }
  if (var.tag == 3) {
    bVar1 = operator==("foo",(String *)b);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      if (var.tag != 3) {
        _::Debug::Fault::Fault
                  ((Fault *)&var2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                   ,0x40,FAILED,"var.tryGet<String>() != nullptr","");
        _::Debug::Fault::fatal((Fault *)&var2);
      }
      _::Debug::log<char_const(&)[382],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == ((*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<String>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\\\", 64, ::kj::Exception::Type::FAILED, \\\"var.tryGet<String>()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", \"foo\", (*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<String>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\", 64, ::kj::Exception::Type::FAILED, \"var.tryGet<String>()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [382])
                  "failed: expected (\"foo\") == ((*({ auto _kj_result = ::kj::_::readMaybe(var.tryGet<String>()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++\", 64, ::kj::Exception::Type::FAILED, \"var.tryGet<String>()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(char (*) [4])0x357ec7,(String *)b);
    }
    OneOf<int,_float,_kj::String>::moveFrom(&var2,&var);
    bVar1 = operator==("",(String *)b);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[45],char_const(&)[1],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x43,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (var.get<String>())\", \"\", var.get<String>()"
                 ,(char (*) [45])"failed: expected (\"\") == (var.get<String>())",
                 (char (*) [1])0x33812f,(String *)b);
    }
    b_00 = &var2.field_1;
    bVar1 = operator==("foo",(String *)b_00);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x44,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (var2.get<String>())\", \"foo\", var2.get<String>()"
                 ,(char (*) [49])"failed: expected (\"foo\") == (var2.get<String>())",
                 (char (*) [4])0x357ec7,(String *)b_00);
    }
    OneOf<int,_float,_kj::String>::operator=(&var,&var2);
    bVar1 = operator==("foo",(String *)b);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[48],char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x47,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (var.get<String>())\", \"foo\", var.get<String>()"
                 ,(char (*) [48])"failed: expected (\"foo\") == (var.get<String>())",
                 (char (*) [4])0x357ec7,(String *)b);
    }
    bVar1 = operator==("",(String *)b_00);
    if (!bVar1 && _::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[46],char_const(&)[1],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
                 ,0x48,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (var2.get<String>())\", \"\", var2.get<String>()"
                 ,(char (*) [46])"failed: expected (\"\") == (var2.get<String>())",
                 (char (*) [1])0x33812f,(String *)b_00);
    }
    OneOf<int,_float,_kj::String>::~OneOf(&var2);
    OneOf<int,_float,_kj::String>::~OneOf(&var);
    return;
  }
  _::Debug::Fault::Fault
            ((Fault *)&var2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/one-of-test.c++"
             ,0x40,FAILED,"var.tryGet<String>() != nullptr","");
  _::Debug::Fault::fatal((Fault *)&var2);
}

Assistant:

TEST(OneOf, Basic) {
  OneOf<int, float, String> var;

  EXPECT_FALSE(var.is<int>());
  EXPECT_FALSE(var.is<float>());
  EXPECT_FALSE(var.is<String>());
  EXPECT_TRUE(var.tryGet<int>() == nullptr);
  EXPECT_TRUE(var.tryGet<float>() == nullptr);
  EXPECT_TRUE(var.tryGet<String>() == nullptr);

  var.init<int>(123);

  EXPECT_TRUE(var.is<int>());
  EXPECT_FALSE(var.is<float>());
  EXPECT_FALSE(var.is<String>());

  EXPECT_EQ(123, var.get<int>());
#if !KJ_NO_EXCEPTIONS && defined(KJ_DEBUG)
  EXPECT_ANY_THROW(var.get<float>());
  EXPECT_ANY_THROW(var.get<String>());
#endif

  EXPECT_EQ(123, KJ_ASSERT_NONNULL(var.tryGet<int>()));
  EXPECT_TRUE(var.tryGet<float>() == nullptr);
  EXPECT_TRUE(var.tryGet<String>() == nullptr);

  var.init<String>(kj::str("foo"));

  EXPECT_FALSE(var.is<int>());
  EXPECT_FALSE(var.is<float>());
  EXPECT_TRUE(var.is<String>());

  EXPECT_EQ("foo", var.get<String>());

  EXPECT_TRUE(var.tryGet<int>() == nullptr);
  EXPECT_TRUE(var.tryGet<float>() == nullptr);
  EXPECT_EQ("foo", KJ_ASSERT_NONNULL(var.tryGet<String>()));

  OneOf<int, float, String> var2 = kj::mv(var);
  EXPECT_EQ("", var.get<String>());
  EXPECT_EQ("foo", var2.get<String>());

  var = kj::mv(var2);
  EXPECT_EQ("foo", var.get<String>());
  EXPECT_EQ("", var2.get<String>());

  if (false) {
    var.allHandled<3>();
    // var.allHandled<2>();  // doesn't compile
  }
}